

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

string * __thiscall
soul::heart::Parser::readVariableIdentifier_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  CompileMessage CStack_48;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).currentStringValue);
  bVar1 = matchesAnyIdentifier(this);
  args_00 = extraout_RDX;
  if (bVar1) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)0x275b94);
    args_00 = args;
    if (!bVar1) {
      Errors::invalidVariableName<std::__cxx11::string&>
                (&CStack_48,(Errors *)__return_storage_ptr__,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&CStack_48);
      CompileMessage::~CompileMessage(&CStack_48);
      args_00 = extraout_RDX_00;
    }
  }
  if (__return_storage_ptr__->_M_string_length < 2) {
    Errors::invalidVariableName<std::__cxx11::string&>
              (&CStack_48,(Errors *)__return_storage_ptr__,args_00);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&CStack_48);
    CompileMessage::~CompileMessage(&CStack_48);
  }
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x275b94);
  return __return_storage_ptr__;
}

Assistant:

std::string readVariableIdentifier()
    {
        auto name = currentStringValue;

        if (matchesAnyIdentifier() && ! matches (Token::variableIdentifier))
            throwError (Errors::invalidVariableName (name));

        if (name.length() < 2)
            throwError (Errors::invalidVariableName (name));

        expect (Token::variableIdentifier);

        return name;
    }